

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O0

void __thiscall Farm::clearBaskets(Farm *this)

{
  anon_class_8_1_8991fb9c local_128;
  function<void_()> local_120;
  allocator local_f9;
  string local_f8 [39];
  anon_class_1_0_00000001 local_d1;
  function<void_()> local_d0;
  allocator local_a9;
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Menu showMenu;
  Farm *this_local;
  
  showMenu._56_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Clear deliveries made from file?",&local_71);
  Menu::Menu((Menu *)local_50,(string *)local_70,false);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"No",&local_a9);
  std::function<void()>::function<Farm::clearBaskets()::__0,void>
            ((function<void()> *)&local_d0,&local_d1);
  Menu::addOption((Menu *)local_50,(string *)local_a8,&local_d0);
  std::function<void_()>::~function(&local_d0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"Yes",&local_f9);
  local_128.this = this;
  std::function<void()>::function<Farm::clearBaskets()::__1,void>
            ((function<void()> *)&local_120,&local_128);
  Menu::addOption((Menu *)local_50,(string *)local_f8,&local_120);
  std::function<void_()>::~function(&local_120);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  Menu::start((Menu *)local_50);
  Menu::~Menu((Menu *)local_50);
  return;
}

Assistant:

void Farm::clearBaskets() {
    Menu showMenu("Clear deliveries made from file?", false);
    showMenu.addOption("No", EXIT);
    showMenu.addOption("Yes", [&](){ baskets.clear(); cout << "Baskets successfully removed!" << endl; clientsFileChanged = true; enterWait();});
    showMenu.start();
}